

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O0

int testValidSoftmax(void)

{
  bool bVar1;
  ModelDescription *pMVar2;
  FeatureDescription *pFVar3;
  FeatureType *pFVar4;
  ArrayFeatureType *this;
  NeuralNetwork *this_00;
  Tensor *this_01;
  ostream *poVar5;
  undefined1 local_a0 [8];
  Result res;
  NeuralNetworkLayer *layer;
  NeuralNetwork *nn;
  FeatureDescription *out3;
  ArrayFeatureType *shape;
  FeatureDescription *topIn;
  Model m1;
  
  CoreML::Specification::Model::Model((Model *)&topIn);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  pFVar3 = CoreML::Specification::ModelDescription::add_input(pMVar2);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"input");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  this = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  CoreML::Specification::ArrayFeatureType::add_shape(this,5);
  CoreML::Specification::ArrayFeatureType::add_shape(this,5);
  CoreML::Specification::ArrayFeatureType::add_shape(this,5);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  pFVar3 = CoreML::Specification::ModelDescription::add_output(pMVar2);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"probs");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  this_00 = CoreML::Specification::Model::mutable_neuralnetwork((Model *)&topIn);
  CoreML::Specification::NeuralNetwork::set_arrayinputshapemapping(this_00,EXACT_ARRAY_MAPPING);
  res.m_message.field_2._8_8_ = CoreML::Specification::NeuralNetwork::add_layers(this_00);
  CoreML::Specification::NeuralNetworkLayer::add_input
            ((NeuralNetworkLayer *)res.m_message.field_2._8_8_,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output
            ((NeuralNetworkLayer *)res.m_message.field_2._8_8_,"probs");
  this_01 = CoreML::Specification::NeuralNetworkLayer::add_inputtensor
                      ((NeuralNetworkLayer *)res.m_message.field_2._8_8_);
  CoreML::Specification::Tensor::set_rank(this_01,3);
  CoreML::Specification::NeuralNetworkLayer::mutable_softmax
            ((NeuralNetworkLayer *)res.m_message.field_2._8_8_);
  CoreML::validate<(MLModelType)500>((Result *)local_a0,(Model *)&topIn);
  bVar1 = CoreML::Result::good((Result *)local_a0);
  if (!bVar1) {
    poVar5 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xcbd);
    poVar5 = std::operator<<(poVar5,": error: ");
    poVar5 = std::operator<<(poVar5,"(res).good()");
    poVar5 = std::operator<<(poVar5," was false, expected true.");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  m1._oneof_case_[0]._1_3_ = 0;
  m1._oneof_case_[0]._0_1_ = !bVar1;
  CoreML::Result::~Result((Result *)local_a0);
  CoreML::Specification::Model::~Model((Model *)&topIn);
  return m1._oneof_case_[0];
}

Assistant:

int testValidSoftmax() {

    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(5);
    shape->add_shape(5);
    shape->add_shape(5);

    auto *out3 = m1.mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_multiarraytype();

    const auto nn = m1.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    Specification::NeuralNetworkLayer *layer = nn->add_layers();
    layer->add_input("input");
    layer->add_output("probs");
    layer->add_inputtensor()->set_rank(3);
    (void) layer->mutable_softmax();

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_GOOD(res);
    return 0;
}